

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerHeap::modify(TimerHeap *this,size_t index)

{
  bool bVar1;
  __shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *this_00;
  element_type *t;
  size_t parent;
  size_t index_local;
  TimerHeap *this_local;
  
  if (index != 0) {
    p_Var2 = (__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::
             operator[](&this->timerHeap_,index);
    this_00 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (p_Var2);
    p_Var2 = (__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::
             operator[](&this->timerHeap_,index - 1 >> 1);
    t = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  (p_Var2);
    bVar1 = Timer::timeType_::operator<(&this_00->timeout_,&t->timeout_);
    if (bVar1) {
      upHeap(this,index);
      return;
    }
  }
  downHeap(this,index);
  return;
}

Assistant:

void TimerHeap::modify(size_t index) {
    size_t parent = (index - 1) / 2;
    if (index > 0 && timerHeap_[index]->timeout_ < timerHeap_[parent]->timeout_)
        upHeap(index);
    else 
        downHeap(index);
}